

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtea.c
# Opt level: O3

int mbedtls_xtea_self_test(int verbose)

{
  int iVar1;
  long lVar2;
  uchar buf [8];
  mbedtls_xtea_context ctx;
  uchar local_50 [8];
  mbedtls_xtea_context local_48;
  
  local_48.k[0] = 0;
  local_48.k[1] = 0;
  local_48.k[2] = 0;
  local_48.k[3] = 0;
  lVar2 = 0;
  do {
    while( true ) {
      if (verbose != 0) {
        printf("  XTEA test #%d: ",(ulong)((int)lVar2 + 1));
      }
      local_50 = xtea_test_pt[lVar2];
      mbedtls_xtea_setup(&local_48,xtea_test_key[lVar2]);
      mbedtls_xtea_crypt_ecb(&local_48,1,local_50,local_50);
      if (local_50 != xtea_test_ct[lVar2]) {
        iVar1 = 1;
        if (verbose != 0) {
          puts("failed");
        }
        goto LAB_00102ce7;
      }
      if (verbose != 0) break;
      lVar2 = lVar2 + 1;
      if (lVar2 == 6) {
LAB_00102ce5:
        iVar1 = 0;
LAB_00102ce7:
        lVar2 = 0;
        do {
          *(undefined1 *)((long)local_48.k + lVar2) = 0;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x10);
        return iVar1;
      }
    }
    puts("passed");
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  putchar(10);
  goto LAB_00102ce5;
}

Assistant:

int mbedtls_xtea_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char buf[8];
    mbedtls_xtea_context ctx;

    mbedtls_xtea_init( &ctx );
    for( i = 0; i < 6; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  XTEA test #%d: ", i + 1 );

        memcpy( buf, xtea_test_pt[i], 8 );

        mbedtls_xtea_setup( &ctx, xtea_test_key[i] );
        mbedtls_xtea_crypt_ecb( &ctx, MBEDTLS_XTEA_ENCRYPT, buf, buf );

        if( memcmp( buf, xtea_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_xtea_free( &ctx );

    return( ret );
}